

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

int fct_xchk2_fn(char *condition,int is_pass,char *format,...)

{
  size_t sVar1;
  undefined8 *puVar2;
  fctkern_t *pfVar3;
  char *__src;
  char in_AL;
  char *__dest;
  undefined8 in_RCX;
  fct_test_t *list;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  __src = fct_xchk_file;
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f0 = &args[0].overflow_arg_area;
  local_f8 = 0x3000000018;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (condition == (char *)0x0) {
    __assert_fail("cndtn != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36b
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
                 );
  }
  if (fct_xchk_file == (char *)0x0) {
    __assert_fail("file != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36c
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
                 );
  }
  if ((fct_xchk_lineno & 1) == 0) {
    __assert_fail("lineno > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36d
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
                 );
  }
  __dest = (char *)calloc(1,0x308);
  if (__dest == (char *)0x0) {
    fctkern__log_warn(fct_xchk_kern,"out of memory (aborting test)");
  }
  else {
    strncpy(__dest,condition,0x100);
    __dest[0xff] = '\0';
    strncpy(__dest + 0x100,__src,0x100);
    __dest[0x1ff] = '\0';
    __dest[0x200] = '\x1c';
    __dest[0x201] = '\0';
    __dest[0x202] = '\0';
    __dest[0x203] = '\0';
    __dest[0x204] = '\x01';
    __dest[0x205] = '\0';
    __dest[0x206] = '\0';
    __dest[0x207] = '\0';
    vsnprintf(__dest + 0x208,0x100,"always succeed",&local_f8);
    if (fct_xchk_test == (fct_test_t *)0x0) {
      __assert_fail("test != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x40a,"void fct_test__add(fct_test_t *, fctchk_t *)");
    }
    list = (fct_test_t *)&fct_xchk_test->passed_chks;
    if (*(int *)(__dest + 0x204) == 0) {
      list = fct_xchk_test;
    }
    fct_nlist__append(&list->failed_chks,__dest);
    pfVar3 = fct_xchk_kern;
    if (fct_xchk_kern == (fctkern_t *)0x0) {
      __assert_fail("nk != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x94b,"void fctkern__log_chk(fctkern_t *, const fctchk_t *)");
    }
    sVar1 = (fct_xchk_kern->logger_list).used_itm_num;
    if (sVar1 != 0) {
      uVar4 = 0;
      do {
        if ((pfVar3->logger_list).used_itm_num <= uVar4) {
          __assert_fail("idx < list->used_itm_num",
                        "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                        ,0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
        }
        puVar2 = (undefined8 *)(pfVar3->logger_list).itm_list[uVar4];
        puVar2[0xc] = __dest;
        (*(code *)*puVar2)(puVar2,puVar2 + 0xb);
        uVar4 = uVar4 + 1;
      } while (sVar1 != uVar4);
    }
  }
  fct_xchk_lineno = 0;
  fct_xchk_file = (char *)0x0;
  fct_xchk_test = (fct_test_t *)0x0;
  fct_xchk_kern = (fctkern_t *)0x0;
  return 0;
}

Assistant:

static int
fct_xchk2_fn(const char *condition, int is_pass, char const *format, ...)
{
    int r =0;
    va_list args;
    va_start(args, format);
    r = _fct_xchk_fn_varg(condition, is_pass, format, args);
    va_end(args);
    return r;
}